

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# missing.cc
# Opt level: O0

int memicmp(void *s1,void *s2,size_t len)

{
  int iVar1;
  type pcVar2;
  pointer __s1;
  pointer __s2;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  size_t i;
  __array x2;
  __array x1;
  size_t in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  size_t in_stack_ffffffffffffffb8;
  undefined8 local_40;
  
  std::make_unique<char[]>(in_stack_ffffffffffffffb8);
  std::make_unique<char[]>(in_stack_ffffffffffffffb8);
  for (local_40 = 0; local_40 < in_RDX; local_40 = local_40 + 1) {
    iVar1 = tolower((int)*(char *)(in_RDI + local_40));
    pcVar2 = std::unique_ptr<char[],_std::default_delete<char[]>_>::operator[]
                       ((unique_ptr<char[],_std::default_delete<char[]>_> *)
                        CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                        in_stack_ffffffffffffff98);
    *pcVar2 = (char)iVar1;
    iVar1 = tolower((int)*(char *)(in_RSI + local_40));
    in_stack_ffffffffffffffa4 = CONCAT13((char)iVar1,(int3)in_stack_ffffffffffffffa4);
    pcVar2 = std::unique_ptr<char[],_std::default_delete<char[]>_>::operator[]
                       ((unique_ptr<char[],_std::default_delete<char[]>_> *)
                        CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                        in_stack_ffffffffffffff98);
    *pcVar2 = (char)((uint)in_stack_ffffffffffffffa4 >> 0x18);
  }
  __s1 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                   ((unique_ptr<char[],_std::default_delete<char[]>_> *)
                    CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  __s2 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                   ((unique_ptr<char[],_std::default_delete<char[]>_> *)
                    CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  iVar1 = memcmp(__s1,__s2,in_RDX);
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)
             CONCAT44(in_stack_ffffffffffffffa4,iVar1));
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)
             CONCAT44(in_stack_ffffffffffffffa4,iVar1));
  return iVar1;
}

Assistant:

int
memicmp( const void* s1, const void* s2, size_t len )
{
    const auto x1 = std::make_unique<char[]>(len);
    const auto x2 = std::make_unique<char[]>(len);

    for (size_t i = 0; i < len; ++i) {
        x1[i] = tolower(static_cast<const char*>(s1)[i]);
        x2[i] = tolower(static_cast<const char*>(s2)[i]);
    }
    return memcmp(x1.get(), x2.get(), len);
}